

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall
pbrt::syntactic::LightSource::LightSource
          (LightSource *this,string *type,Transform *transform,SP *attributes)

{
  long lVar1;
  Transform *pTVar2;
  byte bVar3;
  
  bVar3 = 0;
  Node::Node(&this->super_Node,type);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_toString_abi_cxx11__0018cd48;
  pTVar2 = &this->transform;
  for (lVar1 = 0x18; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pTVar2->atStart).l.vx.x = (transform->atStart).l.vx.x;
    transform = (Transform *)((long)transform + (ulong)bVar3 * -8 + 4);
    pTVar2 = (Transform *)((long)pTVar2 + (ulong)bVar3 * -8 + 4);
  }
  std::__shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->attributes).
              super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>,
             &attributes->
              super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

LightSource(const std::string &type, 
                  const Transform &transform,
                  Attributes::SP  attributes)
        : Node(type),
          transform(transform),
          attributes(attributes)
      {}